

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

string * duckdb::FormatOptionLine<unsigned_long>
                   (string *__return_storage_ptr__,string *name,CSVOption<unsigned_long> *option)

{
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_90,name," = ");
  CSVOption<unsigned_long>::FormatValue_abi_cxx11_(&local_b0,option);
  ::std::operator+(&local_70,&local_90,&local_b0);
  ::std::operator+(&local_50,&local_70," ");
  CSVOption<unsigned_long>::FormatSet_abi_cxx11_(&local_d0,option);
  ::std::operator+(&local_30,&local_50,&local_d0);
  ::std::operator+(__return_storage_ptr__,&local_30,"\n  ");
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

string FormatOptionLine(const string &name, const CSVOption<T> &option) {
	return name + " = " + option.FormatValue() + " " + option.FormatSet() + "\n  ";
}